

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&),cs_impl::any(*)(cs_impl::any_const&,std::deque<cs_impl::any,std::allocator<cs_impl::any>>const&)>
::_call<0,1>(cni_helper<cs_impl::any_(*)(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&),_cs_impl::any_(*)(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
             *this,vector *args,sequence<0,_1> *param_3)

{
  reference val;
  any *this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  any *in_RSI;
  proxy *in_RDI;
  var *in_stack_000000d0;
  proxy *__args;
  any in_stack_ffffffffffffffd8;
  
  __args = in_RDI;
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  this_00 = try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_0UL>::
            convert(val);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,1);
  try_convert_and_check<const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_1UL>
  ::convert(in_stack_000000d0);
  std::
  function<cs_impl::any_(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
  ::operator()((function<cs_impl::any_(const_cs_impl::any_&,_const_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&)>
                *)in_stack_ffffffffffffffd8.mDat,(any *)__args,
               (deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI);
  type_convertor<cs_impl::any,_cs_impl::any>::convert<cs_impl::any>((any *)&stack0xffffffffffffffd8)
  ;
  any::any(this_00,in_RSI);
  any::~any((any *)0x4de9d7);
  return (any)__args;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}